

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

double bsc_costs_std_2tree_put(bsc_group_t group,bsc_coll_params_t *set,bsc_size_t n)

{
  int iVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  
  if (group == (bsc_group_t)0x0) {
    iVar1 = bsp_nprocs();
  }
  else {
    iVar1 = *group;
  }
  dVar3 = bsc_L(BSC_PUT);
  if (0 < n) {
    lVar2 = 0;
    do {
      dVar4 = bsc_g(BSC_PUT,*(int *)((long)&set->size + lVar2));
      dVar3 = dVar3 + (double)*(int *)((long)&set->size + lVar2) * dVar4;
      lVar2 = lVar2 + 0x30;
    } while ((ulong)(uint)n * 0x30 != lVar2);
  }
  dVar4 = 0.0;
  if (iVar1 != 1) {
    iVar1 = uint32_log2(iVar1 - 1);
    dVar4 = dVar3 * (double)(iVar1 + 1);
  }
  return dVar4;
}

Assistant:

double bsc_costs_std_2tree_put(  bsc_group_t group,
         bsc_coll_params_t * set, bsc_size_t n )
{
    bsc_size_t i;
    group_t * g = group;
    bsc_pid_t P = g?g->size:bsp_nprocs() ;
    double one_phase = bsc_L(BSC_PUT);
    for ( i = 0; i < n ; ++i )
        one_phase += bsc_g(BSC_PUT, set[i].size) * set[i].size;

    return P==1?0:(int_log2(P-1)+1) * one_phase ;
}